

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O3

void qwindowcontainer_traverse(QWidget *parent,qwindowcontainer_traverse_callback callback)

{
  QWidget *pQVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = *(ulong *)(parent + 1);
  if (uVar3 != 0) {
    uVar4 = 0;
    do {
      pQVar1 = (QWidget *)(&parent->data->winid)[uVar4];
      if ((((pQVar1 != (QWidget *)0x0) && ((*(byte *)(*(long *)&pQVar1->field_0x8 + 0x30) & 1) != 0)
           ) && (lVar2 = *(long *)(*(long *)&pQVar1->field_0x8 + 0x78), lVar2 != 0)) &&
         ((*(byte *)(lVar2 + 0x7d) & 1) != 0)) {
        (*callback)(pQVar1);
        uVar3 = *(ulong *)(parent + 1);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < uVar3);
  }
  return;
}

Assistant:

constexpr qsizetype size() const noexcept
    {
#if __has_cpp_attribute(assume)
        constexpr size_t MaxSize = maxSize();
        [[assume(size_t(d.size) <= MaxSize)]];
#endif
        return d.size;
    }